

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_allocator.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnDataAllocator::UnswizzlePointers
          (ColumnDataAllocator *this,ChunkManagementState *state,Vector *result,idx_t v_offset,
          uint16_t count,uint32_t block_id,uint32_t offset)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  data_ptr_t pdVar4;
  long lVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  data_ptr_t pdVar8;
  uint *puVar9;
  
  ::std::mutex::lock(&this->lock);
  FlatVector::VerifyFlatVector(result);
  pdVar8 = result->data;
  uVar2 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(v_offset);
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(count + v_offset);
  uVar7 = (ulong)uVar2;
  if (uVar2 < uVar3) {
    uVar2 = uVar3;
  }
  puVar9 = (uint *)(pdVar8 + uVar7 * 0x10);
  do {
    if (uVar3 <= uVar7) {
LAB_0026e15a:
      pdVar4 = GetDataPointer(this,state,block_id,offset);
      uVar7 = (ulong)uVar2;
      lVar5 = uVar7 * 0x10;
      if (*(uint *)(pdVar8 + lVar5) < 0xd) {
        pdVar6 = pdVar8 + lVar5 + 4;
      }
      else {
        pdVar6 = *(data_ptr_t *)(pdVar8 + lVar5 + 8);
      }
      if (pdVar6 != pdVar4) {
        pdVar8 = pdVar8 + lVar5 + 8;
        for (; uVar7 < uVar3; uVar7 = uVar7 + 1) {
          bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar7);
          if ((bVar1) && (0xc < (ulong)*(uint *)(pdVar8 + -8))) {
            *(data_ptr_t *)pdVar8 = pdVar4;
            pdVar4 = pdVar4 + *(uint *)(pdVar8 + -8);
          }
          pdVar8 = pdVar8 + 0x10;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
      return;
    }
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar7);
    if ((bVar1) && (0xc < *puVar9)) {
      uVar2 = (uint)uVar7;
      goto LAB_0026e15a;
    }
    uVar7 = uVar7 + 1;
    puVar9 = puVar9 + 4;
  } while( true );
}

Assistant:

void ColumnDataAllocator::UnswizzlePointers(ChunkManagementState &state, Vector &result, idx_t v_offset, uint16_t count,
                                            uint32_t block_id, uint32_t offset) {
	D_ASSERT(result.GetType().InternalType() == PhysicalType::VARCHAR);
	lock_guard<mutex> guard(lock);

	auto &validity = FlatVector::Validity(result);
	auto strings = FlatVector::GetData<string_t>(result);

	// find first non-inlined string
	auto i = NumericCast<uint32_t>(v_offset);
	const uint32_t end = NumericCast<uint32_t>(v_offset + count);
	for (; i < end; i++) {
		if (!validity.RowIsValid(i)) {
			continue;
		}
		if (!strings[i].IsInlined()) {
			break;
		}
	}
	// at least one string must be non-inlined, otherwise this function should not be called
	D_ASSERT(i < end);

	auto base_ptr = char_ptr_cast(GetDataPointer(state, block_id, offset));
	if (strings[i].GetData() == base_ptr) {
		// pointers are still valid
		return;
	}

	// pointer mismatch! pointers are invalid, set them correctly
	for (; i < end; i++) {
		if (!validity.RowIsValid(i)) {
			continue;
		}
		if (strings[i].IsInlined()) {
			continue;
		}
		strings[i].SetPointer(base_ptr);
		base_ptr += strings[i].GetSize();
	}
}